

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_uri_boolean(char *zFilename,char *zParam,int bDflt)

{
  char *z_00;
  int in_EDX;
  byte bVar1;
  char *z;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  
  z_00 = sqlite3_uri_parameter
                   ((char *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                    (char *)0x151525);
  bVar1 = in_EDX != 0;
  if (z_00 != (char *)0x0) {
    bVar1 = sqlite3GetBoolean(z_00,(u8)((uint)in_stack_ffffffffffffffdc >> 0x18));
  }
  return (uint)bVar1;
}

Assistant:

SQLITE_API int sqlite3_uri_boolean(const char *zFilename, const char *zParam, int bDflt){
  const char *z = sqlite3_uri_parameter(zFilename, zParam);
  bDflt = bDflt!=0;
  return z ? sqlite3GetBoolean(z, bDflt) : bDflt;
}